

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

void ensureBits25(LodePNGBitReader *reader,size_t nbits)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar1 = reader->size;
  uVar3 = reader->bp >> 3;
  if (uVar3 + 3 < uVar1) {
    uVar2 = *(uint *)(reader->data + uVar3);
  }
  else {
    reader->buffer = 0;
    uVar2 = 0;
    if (uVar3 < uVar1) {
      uVar2 = (uint)reader->data[uVar3];
      reader->buffer = uVar2;
    }
    if (uVar3 + 1 < uVar1) {
      uVar2 = uVar2 | (uint)reader->data[uVar3 + 1] << 8;
      reader->buffer = uVar2;
    }
    if (uVar3 + 2 < uVar1) {
      uVar2 = uVar2 | (uint)reader->data[uVar3 + 2] << 0x10;
    }
  }
  reader->buffer = uVar2 >> ((byte)reader->bp & 7);
  return;
}

Assistant:

static LODEPNG_INLINE void ensureBits25(LodePNGBitReader* reader, size_t nbits) {
  size_t start = reader->bp >> 3u;
  size_t size = reader->size;
  if(start + 3u < size) {
    reader->buffer = (unsigned)reader->data[start + 0] | ((unsigned)reader->data[start + 1] << 8u) |
                     ((unsigned)reader->data[start + 2] << 16u) | ((unsigned)reader->data[start + 3] << 24u);
    reader->buffer >>= (reader->bp & 7u);
  } else {
    reader->buffer = 0;
    if(start + 0u < size) reader->buffer |= reader->data[start + 0];
    if(start + 1u < size) reader->buffer |= ((unsigned)reader->data[start + 1] << 8u);
    if(start + 2u < size) reader->buffer |= ((unsigned)reader->data[start + 2] << 16u);
    reader->buffer >>= (reader->bp & 7u);
  }
  (void)nbits;
}